

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O3

Vec_Ptr_t * Ptr_AbcDeriveNtk(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  Vec_Ptr_t *pVVar3;
  void *pvVar4;
  
  pVVar1 = (Vec_Ptr_t *)malloc(0x10);
  pVVar1->nCap = 5;
  ppvVar2 = (void **)malloc(0x28);
  pVVar1->pArray = ppvVar2;
  *ppvVar2 = pNtk->pName;
  pVVar3 = Ptr_AbcDeriveInputs(pNtk);
  ppvVar2[1] = pVVar3;
  pVVar3 = Ptr_AbcDeriveOutputs(pNtk);
  ppvVar2[2] = pVVar3;
  pvVar4 = calloc(1,0x10);
  ppvVar2[3] = pvVar4;
  pVVar3 = Ptr_AbcDeriveBoxes(pNtk);
  pVVar1->nSize = 5;
  ppvVar2[4] = pVVar3;
  return pVVar1;
}

Assistant:

Vec_Ptr_t * Ptr_AbcDeriveNtk( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNtk = Vec_PtrAllocExact( 5 );
    Vec_PtrPush( vNtk, Abc_NtkName(pNtk) );
    Vec_PtrPush( vNtk, Ptr_AbcDeriveInputs(pNtk) );
    Vec_PtrPush( vNtk, Ptr_AbcDeriveOutputs(pNtk) );
    Vec_PtrPush( vNtk, Vec_PtrAllocExact(0) );
    Vec_PtrPush( vNtk, Ptr_AbcDeriveBoxes(pNtk) );
    assert( Ptr_CheckArray(vNtk) );
    return vNtk;
}